

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Varint64Truncation::_Run(_Test_Varint64Truncation *this)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  Tester local_538;
  Tester local_398;
  Tester local_1f8;
  ulong local_58;
  size_t len;
  uint64_t result;
  string local_38 [8];
  string s;
  unsigned_long local_18;
  uint64_t large_value;
  _Test_Varint64Truncation *this_local;
  
  local_18 = 0x8000000000000064;
  large_value = (uint64_t)this;
  std::__cxx11::string::string(local_38);
  PutVarint64((string *)local_38,local_18);
  local_58 = 0;
  while( true ) {
    uVar1 = local_58;
    lVar2 = std::__cxx11::string::size();
    if (lVar2 - 1U <= uVar1) break;
    test::Tester::Tester
              (&local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0xa7);
    pcVar3 = (char *)std::__cxx11::string::data();
    lVar2 = std::__cxx11::string::data();
    pcVar3 = GetVarint64Ptr(pcVar3,(char *)(lVar2 + local_58),&len);
    test::Tester::Is(&local_1f8,pcVar3 == (char *)0x0,
                     "GetVarint64Ptr(s.data(), s.data() + len, &result) == nullptr");
    test::Tester::~Tester(&local_1f8);
    local_58 = local_58 + 1;
  }
  test::Tester::Tester
            (&local_398,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0xaa);
  pcVar3 = (char *)std::__cxx11::string::data();
  lVar2 = std::__cxx11::string::data();
  lVar4 = std::__cxx11::string::size();
  pcVar3 = GetVarint64Ptr(pcVar3,(char *)(lVar2 + lVar4),&len);
  test::Tester::Is(&local_398,pcVar3 != (char *)0x0,
                   "GetVarint64Ptr(s.data(), s.data() + s.size(), &result) != nullptr");
  test::Tester::~Tester(&local_398);
  test::Tester::Tester
            (&local_538,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0xab);
  test::Tester::IsEq<unsigned_long,unsigned_long>(&local_538,&local_18,&len);
  test::Tester::~Tester(&local_538);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

TEST(Coding, Varint64Truncation) {
  uint64_t large_value = (1ull << 63) + 100ull;
  std::string s;
  PutVarint64(&s, large_value);
  uint64_t result;
  for (size_t len = 0; len < s.size() - 1; len++) {
    ASSERT_TRUE(GetVarint64Ptr(s.data(), s.data() + len, &result) == nullptr);
  }
  ASSERT_TRUE(GetVarint64Ptr(s.data(), s.data() + s.size(), &result) !=
              nullptr);
  ASSERT_EQ(large_value, result);
}